

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::UntypedFunctionMockerBase::UntypedInvokeWith
          (UntypedFunctionMockerBase *this,void *untyped_args)

{
  CallReaction reaction_00;
  int iVar1;
  size_type sVar2;
  void *pvVar3;
  char *pcVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ostream *poVar5;
  UntypedFunctionMockerBase *pUVar6;
  ostream *local_888;
  ostream *local_870;
  ostream *local_860;
  UntypedFunctionMockerBase *local_840;
  bool local_819;
  undefined1 *local_808;
  ostream *local_7f8;
  undefined1 *local_7e0;
  undefined1 *local_7c0;
  bool local_792;
  bool local_791;
  undefined1 local_788 [8];
  anon_class_48_6_2149f011 handle_failures;
  anon_class_32_4_310768c0 perform_action;
  UntypedActionResultHolderBase *result;
  string local_728 [38];
  bool local_702;
  stringstream local_701;
  bool need_to_report_call;
  ExpectationBase *pEStack_700;
  bool found;
  ExpectationBase *untyped_expectation;
  void *untyped_action;
  stringstream loc;
  ostream aoStack_6e0 [376];
  stringstream local_568 [8];
  stringstream why;
  undefined1 auStack_558 [376];
  stringstream local_3e0 [8];
  stringstream ss;
  ostream local_3d0 [383];
  bool local_251;
  undefined1 local_250 [7];
  bool is_excessive;
  string local_230 [32];
  UntypedFunctionMockerBase *local_210;
  UntypedActionResultHolderBase *result_1;
  stringstream ss_1;
  undefined1 auStack_1f8 [399];
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  bool local_25;
  CallReaction local_24;
  bool need_to_report_uninteresting_call;
  void *pvStack_20;
  CallReaction reaction;
  void *untyped_args_local;
  UntypedFunctionMockerBase *this_local;
  
  pvStack_20 = untyped_args;
  untyped_args_local = this;
  sVar2 = std::
          vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
          ::size(&this->untyped_expectations_);
  if (sVar2 == 0) {
    pvVar3 = MockObject(this);
    local_24 = Mock::GetReactionOnUninterestingCalls(pvVar3);
    if (local_24 == kAllow) {
      local_791 = LogIsVisible(kInfo);
    }
    else {
      if (local_24 == kWarn) {
        local_792 = LogIsVisible(kWarning);
      }
      else {
        local_792 = true;
      }
      local_791 = local_792;
    }
    pvVar3 = pvStack_20;
    local_25 = local_791;
    if (local_791 == false) {
      pcVar4 = Name(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar4,&local_69);
      std::operator+(&local_48,"Function call: ",&local_68);
      iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,&local_48);
      this_local = (UntypedFunctionMockerBase *)CONCAT44(extraout_var,iVar1);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&result_1);
      local_7c0 = (undefined1 *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x208) {
        local_7c0 = auStack_1f8;
      }
      (*this->_vptr_UntypedFunctionMockerBase[5])(this,pvStack_20,local_7c0);
      pvVar3 = pvStack_20;
      std::__cxx11::stringstream::str();
      iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,local_230);
      pUVar6 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_00,iVar1);
      std::__cxx11::string::~string(local_230);
      local_210 = pUVar6;
      if (pUVar6 != (UntypedFunctionMockerBase *)0x0) {
        local_7e0 = (undefined1 *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x208) {
          local_7e0 = auStack_1f8;
        }
        (*pUVar6->_vptr_UntypedFunctionMockerBase[2])(pUVar6,local_7e0);
      }
      reaction_00 = local_24;
      std::__cxx11::stringstream::str();
      ReportUninterestingCall(reaction_00,(string *)local_250);
      std::__cxx11::string::~string((string *)local_250);
      this_local = local_210;
      std::__cxx11::stringstream::~stringstream((stringstream *)&result_1);
    }
  }
  else {
    local_251 = false;
    std::__cxx11::stringstream::stringstream(local_3e0);
    std::__cxx11::stringstream::stringstream(local_568);
    std::__cxx11::stringstream::stringstream((stringstream *)&untyped_action);
    untyped_expectation = (ExpectationBase *)0x0;
    local_7f8 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x3e0) {
      local_7f8 = local_3d0;
    }
    local_808 = (undefined1 *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x568) {
      local_808 = auStack_558;
    }
    iVar1 = (*this->_vptr_UntypedFunctionMockerBase[6])
                      (this,pvStack_20,&untyped_expectation,&local_251,local_7f8,local_808);
    pEStack_700 = (ExpectationBase *)CONCAT44(extraout_var_01,iVar1);
    local_701 = (stringstream)(pEStack_700 != (ExpectationBase *)0x0);
    local_819 = true;
    if (((bool)local_701) && (local_819 = true, (local_251 & 1U) == 0)) {
      local_819 = LogIsVisible(kInfo);
    }
    pvVar3 = pvStack_20;
    local_702 = local_819;
    if (local_819 == false) {
      result._6_1_ = 0;
      result._5_1_ = 0;
      if (untyped_expectation == (ExpectationBase *)0x0) {
        std::allocator<char>::allocator();
        result._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (local_728,"",(allocator<char> *)((long)&result + 7));
        result._5_1_ = 1;
        iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,local_728);
        local_840 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_02,iVar1);
      }
      else {
        iVar1 = (*this->_vptr_UntypedFunctionMockerBase[4])(this,untyped_expectation,pvStack_20);
        local_840 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_03,iVar1);
      }
      this_local = local_840;
      if ((result._5_1_ & 1) != 0) {
        std::__cxx11::string::~string(local_728);
      }
      if ((result._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
      }
    }
    else {
      poVar5 = std::operator<<(local_3d0,"    Function call: ");
      pcVar4 = Name(this);
      std::operator<<(poVar5,pcVar4);
      local_860 = (ostream *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x3e0) {
        local_860 = local_3d0;
      }
      (*this->_vptr_UntypedFunctionMockerBase[7])(this,pvStack_20,local_860);
      if ((((byte)local_701 & 1) != 0) && ((local_251 & 1U) == 0)) {
        local_870 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x6f0) {
          local_870 = aoStack_6e0;
        }
        ExpectationBase::DescribeLocationTo(pEStack_700,local_870);
      }
      handle_failures.loc = (stringstream *)&untyped_expectation;
      local_788 = (undefined1  [8])local_3e0;
      handle_failures.ss = (stringstream *)local_568;
      handle_failures.why = &local_701;
      handle_failures.found = &local_251;
      handle_failures.is_excessive = (bool *)&stack0xfffffffffffff900;
      handle_failures.untyped_expectation = (ExpectationBase **)&untyped_action;
      pUVar6 = (UntypedFunctionMockerBase *)
               UntypedInvokeWith::anon_class_32_4_310768c0::operator()
                         ((anon_class_32_4_310768c0 *)&handle_failures.loc);
      if (pUVar6 != (UntypedFunctionMockerBase *)0x0) {
        local_888 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x3e0) {
          local_888 = local_3d0;
        }
        (*pUVar6->_vptr_UntypedFunctionMockerBase[2])(pUVar6,local_888);
      }
      UntypedInvokeWith::anon_class_48_6_2149f011::operator()((anon_class_48_6_2149f011 *)local_788)
      ;
      this_local = pUVar6;
    }
    result._0_4_ = 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&untyped_action);
    std::__cxx11::stringstream::~stringstream(local_568);
    std::__cxx11::stringstream::~stringstream(local_3e0);
  }
  return (UntypedActionResultHolderBase *)this_local;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  if (untyped_expectations_.size() == 0) {
    // No expectation is set on this mock method - we have an
    // uninteresting call.

    // We must get Google Mock's reaction on uninteresting calls
    // made on this mock object BEFORE performing the action,
    // because the action may DELETE the mock object and make the
    // following expression meaningless.
    const CallReaction reaction =
        Mock::GetReactionOnUninterestingCalls(MockObject());

    // True if and only if we need to print this call's arguments and return
    // value.  This definition must be kept in sync with
    // the behavior of ReportUninterestingCall().
    const bool need_to_report_uninteresting_call =
        // If the user allows this uninteresting call, we print it
        // only when they want informational messages.
        reaction == kAllow ? LogIsVisible(kInfo) :
                           // If the user wants this to be a warning, we print
                           // it only when they want to see warnings.
            reaction == kWarn
                ? LogIsVisible(kWarning)
                :
                // Otherwise, the user wants this to be an error, and we
                // should always print detailed information in the error.
                true;

    if (!need_to_report_uninteresting_call) {
      // Perform the action without printing the call information.
      return this->UntypedPerformDefaultAction(
          untyped_args, "Function call: " + std::string(Name()));
    }

    // Warns about the uninteresting call.
    ::std::stringstream ss;
    this->UntypedDescribeUninterestingCall(untyped_args, &ss);

    // Calculates the function result.
    UntypedActionResultHolderBase* const result =
        this->UntypedPerformDefaultAction(untyped_args, ss.str());

    // Prints the function result.
    if (result != nullptr) result->PrintAsActionResult(&ss);

    ReportUninterestingCall(reaction, ss.str());
    return result;
  }

  bool is_excessive = false;
  ::std::stringstream ss;
  ::std::stringstream why;
  ::std::stringstream loc;
  const void* untyped_action = nullptr;

  // The UntypedFindMatchingExpectation() function acquires and
  // releases g_gmock_mutex.

  const ExpectationBase* const untyped_expectation =
      this->UntypedFindMatchingExpectation(untyped_args, &untyped_action,
                                           &is_excessive, &ss, &why);
  const bool found = untyped_expectation != nullptr;

  // True if and only if we need to print the call's arguments
  // and return value.
  // This definition must be kept in sync with the uses of Expect()
  // and Log() in this function.
  const bool need_to_report_call =
      !found || is_excessive || LogIsVisible(kInfo);
  if (!need_to_report_call) {
    // Perform the action without printing the call information.
    return untyped_action == nullptr
               ? this->UntypedPerformDefaultAction(untyped_args, "")
               : this->UntypedPerformAction(untyped_action, untyped_args);
  }

  ss << "    Function call: " << Name();
  this->UntypedPrintArgs(untyped_args, &ss);

  // In case the action deletes a piece of the expectation, we
  // generate the message beforehand.
  if (found && !is_excessive) {
    untyped_expectation->DescribeLocationTo(&loc);
  }

  UntypedActionResultHolderBase* result = nullptr;

  auto perform_action = [&] {
    return untyped_action == nullptr
               ? this->UntypedPerformDefaultAction(untyped_args, ss.str())
               : this->UntypedPerformAction(untyped_action, untyped_args);
  };
  auto handle_failures = [&] {
    ss << "\n" << why.str();

    if (!found) {
      // No expectation matches this call - reports a failure.
      Expect(false, nullptr, -1, ss.str());
    } else if (is_excessive) {
      // We had an upper-bound violation and the failure message is in ss.
      Expect(false, untyped_expectation->file(), untyped_expectation->line(),
             ss.str());
    } else {
      // We had an expected call and the matching expectation is
      // described in ss.
      Log(kInfo, loc.str() + ss.str(), 2);
    }
  };
#if GTEST_HAS_EXCEPTIONS
  try {
    result = perform_action();
  } catch (...) {
    handle_failures();
    throw;
  }
#else
  result = perform_action();
#endif

  if (result != nullptr) result->PrintAsActionResult(&ss);
  handle_failures();
  return result;
}